

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentDiscreteActions.cpp
# Opt level: O0

size_t __thiscall
MADPComponentDiscreteActions::GetNrActions(MADPComponentDiscreteActions *this,Index agentI)

{
  size_type sVar1;
  const_reference pvVar2;
  E *this_00;
  stringstream *arg;
  uint in_ESI;
  long in_RDI;
  stringstream ss;
  stringstream local_198 [16];
  ostream local_188 [380];
  uint local_c;
  
  local_c = in_ESI;
  sVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::size
                    ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40));
  if (in_ESI < sVar1) {
    pvVar2 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(in_RDI + 0x40),
                        (ulong)local_c);
    return *pvVar2;
  }
  std::__cxx11::stringstream::stringstream(local_198);
  this_00 = (E *)std::operator<<(local_188,
                                 "Warning: MADPComponentDiscreteActions::GetNrActions(Index agentI) - index out of bounds"
                                );
  std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  arg = (stringstream *)__cxa_allocate_exception(0x28);
  E::E(this_00,arg);
  __cxa_throw(arg,&E::typeinfo,E::~E);
}

Assistant:

size_t MADPComponentDiscreteActions::GetNrActions(Index agentI) const
{    
    if(agentI < _m_nrActions.size())
        return _m_nrActions[agentI];
    else
    {
        stringstream ss;
            ss << "Warning: MADPComponentDiscreteActions::GetNrActions(Index agentI) - index out of bounds"<<endl;
        throw E(ss);
    }
}